

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O1

void check_FX(FX *fx68k)

{
  DLword *pDVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((*(ushort *)&fx68k->field_0x2 & 0xe000) != 0xc000) {
    error("CheckFX:NOT FX");
  }
  uVar2 = fx68k->nextblock;
  uVar4 = (long)fx68k - (long)Stackspace >> 1;
  if (0xffff < uVar4) {
    printf("Stack offset is out of range: 0x%tx\n",uVar4);
  }
  if (uVar2 < (ushort)uVar4) {
    error("FX\'s nextblock field < the FFX.");
  }
  pDVar1 = &fx68k[-1].clink;
  uVar4 = (long)pDVar1 - (long)Stackspace >> 1;
  if (0xffff < uVar4) {
    printf("Stack offset is out of range: 0x%tx\n",uVar4);
  }
  if ((fx68k->alink & 1) == 0) {
    if (((ulong)pDVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar1);
    }
    uVar3 = (uint)((int)pDVar1 - (int)Lisp_world) >> 1 & 0xffff;
  }
  else {
    uVar3 = (uint)fx68k->blink;
  }
  if (uVar3 != ((uint)uVar4 & 0xffff)) {
    if ((fx68k->alink & 1) == 0) {
      if (((ulong)pDVar1 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar1);
      }
      uVar3 = (uint)((int)pDVar1 - (int)Lisp_world) >> 1;
    }
    else {
      uVar3 = (uint)fx68k->blink;
    }
    if ((uVar3 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",
             (ulong)(uVar3 & 0xffff));
    }
    if (((fx68k[-1].blink & 0x200) == 0) || (*pDVar1 != Stackspace[uVar3 & 0xffff])) {
      error("CheckFX:bad residual case");
      return;
    }
  }
  return;
}

Assistant:

void check_FX(FX *fx68k) {
  Bframe *dummybf, *mtmp;
  int mblink;

  /* The FX better really be an FX */

  if (((FX *)(fx68k))->flags != STK_FX) error("CheckFX:NOT FX");

  /* Make sure the NEXTBLOCK field of the FX */
  /* Points BEYOND the start of the FX; some */
  /* stack blocks have been corrupted this   */
  /* way.  --JDS 2/3/98                      */

  if (fx68k->nextblock < StackOffsetFromNative(fx68k) /*+FRAMESIZE*/) {
    error("FX's nextblock field < the FFX.");
  }

  /* Now make sure the FX is connected to */
  /* a Basic Frame.                       */

  dummybf = (Bframe *)DUMMYBF(fx68k);

  /* Check for connection via BLINK field: */
  if (StackOffsetFromNative(dummybf) == GETBLINK(fx68k)) return;

  mblink = GETBLINK(fx68k);
  mtmp = (Bframe *)NativeAligned4FromStackOffset(mblink);
  if ((dummybf->residual != NIL) && (dummybf->ivar == mtmp->ivar))
    return;
  else
    error("CheckFX:bad residual case");

}